

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetMarkChanges_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  Wln_Ntk_t *pWVar4;
  long lVar5;
  long lVar6;
  
  if ((iObj < 0) || ((p->vPathDelays).nSize <= iObj)) {
LAB_00387f62:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar2 = (p->vPathDelays).pArray;
  if (piVar2[(uint)iObj] < 0) {
    return;
  }
  piVar2[(uint)iObj] = -1;
  pWVar4 = p->pNtk;
  if (iObj < (pWVar4->vRefs).nSize) {
    lVar6 = 0;
    do {
      if ((pWVar4->vRefs).pArray[(uint)iObj] <= lVar6) {
        return;
      }
      iVar1 = (p->vFanouts).nSize;
      if (iVar1 <= iObj) break;
      piVar2 = (p->vFanouts).pArray;
      lVar5 = (long)piVar2[(uint)iObj];
      if ((lVar5 < 0) || (iVar1 <= piVar2[(uint)iObj])) goto LAB_00387f62;
      iVar1 = piVar2[lVar5 + lVar6 * 2 + 1];
      if (((long)iVar1 < 0) || ((p->vFanins).nSize <= iVar1)) goto LAB_00387f62;
      piVar3 = (p->vFanins).pArray;
      if (piVar3 == (int *)0x0) {
        return;
      }
      if ((piVar2[lVar5 + lVar6 * 2] != 0) && (piVar3[iVar1] == 0)) {
        Wln_RetMarkChanges_rec(p,piVar2[lVar5 + lVar6 * 2]);
      }
      lVar6 = lVar6 + 1;
      pWVar4 = p->pNtk;
    } while (iObj < (pWVar4->vRefs).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetMarkChanges_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanout, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay < 0 )
        return;
    *pDelay = -1;
    Wln_RetForEachFanout( p, iObj, iFanout, pLink, k )
        if ( !pLink[0] )
            Wln_RetMarkChanges_rec( p, iFanout );
}